

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O0

int lls_svd(double *Ai,double *bi,int M,int N,double *xo)

{
  int iVar1;
  double *U_00;
  double *V_00;
  double *q_00;
  double *C_00;
  int iVar2;
  double dVar3;
  double eps;
  double *C;
  double *q;
  double *V;
  double *U;
  int t;
  int j;
  int i;
  int retcode;
  double *xo_local;
  int N_local;
  int M_local;
  double *bi_local;
  double *Ai_local;
  
  U_00 = (double *)malloc((long)M * 8 * (long)N);
  V_00 = (double *)malloc((long)N * 8 * (long)N);
  q_00 = (double *)malloc((long)N << 3);
  C_00 = (double *)malloc((long)N << 3);
  dVar3 = macheps();
  iVar1 = svd(Ai,M,N,U_00,V_00,q_00);
  if (iVar1 == 0) {
    mmult(bi,U_00,C_00,1,M,N);
    for (t = 0; t < N; t = t + 1) {
      for (U._4_4_ = 0; U._4_4_ < N; U._4_4_ = U._4_4_ + 1) {
        if (ABS(q_00[U._4_4_]) <= dVar3) {
          V_00[t * N + U._4_4_] = 0.0;
        }
        else {
          iVar2 = t * N + U._4_4_;
          V_00[iVar2] = V_00[iVar2] / q_00[U._4_4_];
        }
      }
    }
    mmult(V_00,C_00,xo,N,N,1);
    free(U_00);
    free(V_00);
    free(q_00);
  }
  return iVar1;
}

Assistant:

int lls_svd(double *Ai,double *bi,int M,int N,double *xo) {
	int retcode,i,j,t;
	double *U,*V,*q,*C;
	double eps;

	U = (double*) malloc(sizeof(double) * M*N);
	V = (double*) malloc(sizeof(double) * N*N);
	q = (double*) malloc(sizeof(double) * N);
	C = (double*) malloc(sizeof(double) * N);

	retcode = 0;
	eps = macheps();

	retcode = svd(Ai,M,N,U,V,q);;
	if (retcode != 0) {
		return retcode;
	}

	mmult(bi,U,C,1,M,N);

	for(i = 0; i < N;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (fabs(q[j]) > eps) {
				V[t+j] /= q[j];
			} else {
				V[t+j] = 0.0;
			}
		}
	}

	mmult(V,C,xo,N,N,1);

	free(U);
	free(V);
	free(q);

	return retcode;
}